

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O2

void __thiscall
Problem::Problem(Problem *this,node *bidsArray,int numBids,int numCompanies,int numRegions)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  int *piVar4;
  pointer *ppnVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  _Vector_base<int,_std::allocator<int>_> local_9cc8;
  _Vector_base<int,_std::allocator<int>_> local_9ca8;
  node emptyNode;
  
  local_9ca8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9ca8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9ca8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  State::State(&this->state,(vector<int,_std::allocator<int>_> *)&local_9ca8,0.0,0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_9ca8);
  local_9cc8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9cc8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9cc8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  State::State(&this->initialState,(vector<int,_std::allocator<int>_> *)&local_9cc8,0.0,0);
  uVar7 = (ulong)numCompanies;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar7;
  uVar2 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar6 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar6 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_9cc8);
  (this->validStateStore).c.super__Vector_base<State,_std::allocator<State>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->validStateStore).c.super__Vector_base<State,_std::allocator<State>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->validStateStore).c.super__Vector_base<State,_std::allocator<State>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (ulong *)operator_new__(uVar6);
  *puVar3 = uVar7;
  if (numCompanies != 0) {
    memset((vector<node,_std::allocator<node>_> *)(puVar3 + 1),0,
           ((uVar2 - 0x18) - (uVar2 - 0x18) % 0x18) + 0x18);
  }
  this->problemData = (vector<node,_std::allocator<node>_> *)(puVar3 + 1);
  uVar6 = uVar7 * 4;
  if (numCompanies < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar4 = (int *)operator_new__(uVar6);
  this->maxBids = piVar4;
  this->numCompanies = numCompanies;
  this->numRegions = numRegions;
  this->validStoreSize = 100;
  uVar2 = 0;
  uVar6 = (ulong)(uint)numCompanies;
  if (numCompanies < 1) {
    uVar6 = uVar2;
  }
  for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    emptyNode.cid = (int)uVar7;
    emptyNode.price = 0.0;
    emptyNode.norc = 0;
    std::vector<node,_std::allocator<node>_>::push_back
              ((vector<node,_std::allocator<node>_> *)
               ((long)&(this->problemData->super__Vector_base<node,_std::allocator<node>_>)._M_impl.
                       super__Vector_impl_data._M_start + uVar2),&emptyNode);
    uVar2 = uVar2 + 0x18;
  }
  uVar2 = 0;
  if (0 < numBids) {
    uVar2 = (ulong)(uint)numBids;
  }
  while (bVar8 = uVar2 != 0, uVar2 = uVar2 - 1, bVar8) {
    std::vector<node,_std::allocator<node>_>::push_back
              (this->problemData + bidsArray->cid,bidsArray);
    bidsArray = bidsArray + 1;
  }
  piVar4 = this->maxBids;
  ppnVar5 = &(this->problemData->super__Vector_base<node,_std::allocator<node>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
    piVar4[uVar2] =
         (int)(((long)*ppnVar5 - (long)((_Vector_impl_data *)(ppnVar5 + -1))->_M_start) / 0x9c58);
    ppnVar5 = ppnVar5 + 3;
  }
  return;
}

Assistant:

Problem::Problem(struct node bidsArray[], int numBids, int numCompanies, int numRegions) {
    // get problem data and company size from bidsArray

    this->problemData = new vector<struct node>[numCompanies];
    this->maxBids = new int[numCompanies];
    this->numCompanies = numCompanies;
    this->numRegions = numRegions;
    this->validStoreSize = 100;

    //Add no bid node for each company
    for (int i = 0; i < numCompanies; i++) {
        struct node emptyNode;
        emptyNode.cid = i;
        emptyNode.price = 0;
        emptyNode.norc = 0;
        this->problemData[i].push_back(emptyNode);
    }

    //Arrange input data
    for (int i = 0; i < numBids; i++) {
        int cid = bidsArray[i].cid;
        (this->problemData[cid]).push_back(bidsArray[i]);
    }

    //Initialize maxBids array for all companies
    for (int i = 0; i < numCompanies; i++) {
        this->maxBids[i] = (this->problemData[i]).size();
    }
}